

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.cc
# Opt level: O0

int4 __thiscall
ConstructTpl::fillinBuild
          (ConstructTpl *this,vector<int,_std::allocator<int>_> *check,AddrSpace *const_space)

{
  bool bVar1;
  OpCode OVar2;
  reference ppOVar3;
  ConstTpl *this_00;
  uintb uVar4;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  VarnodeTpl *pVVar8;
  __normal_iterator<OpTpl_**,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_> local_d8;
  const_iterator local_d0;
  ConstTpl local_c8;
  ConstTpl local_a8;
  ConstTpl local_88;
  int local_58;
  int local_54;
  int4 i;
  int4 index;
  OpTpl **local_48;
  VarnodeTpl *local_40;
  VarnodeTpl *indvn;
  OpTpl *op;
  iterator iter;
  AddrSpace *const_space_local;
  vector<int,_std::allocator<int>_> *check_local;
  ConstructTpl *this_local;
  
  iter._M_current = (OpTpl **)const_space;
  __gnu_cxx::__normal_iterator<OpTpl_**,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_>::
  __normal_iterator((__normal_iterator<OpTpl_**,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_> *)
                    &op);
  local_48 = (OpTpl **)std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::begin(&this->vec);
  op = (OpTpl *)local_48;
  do {
    _i = std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::end(&this->vec);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<OpTpl_**,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_>
                        *)&op,(__normal_iterator<OpTpl_**,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_>
                               *)&i);
    if (!bVar1) {
      for (local_58 = 0; uVar5 = (ulong)local_58,
          sVar6 = std::vector<int,_std::allocator<int>_>::size(check), uVar5 < sVar6;
          local_58 = local_58 + 1) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](check,(long)local_58);
        if (*pvVar7 == 0) {
          pVVar8 = (VarnodeTpl *)operator_new(0x28);
          OpTpl::OpTpl((OpTpl *)pVVar8,CPUI_MULTIEQUAL);
          indvn = pVVar8;
          pVVar8 = (VarnodeTpl *)operator_new(0x68);
          ConstTpl::ConstTpl(&local_88,(AddrSpace *)iter._M_current);
          ConstTpl::ConstTpl(&local_a8,real,(long)local_58);
          ConstTpl::ConstTpl(&local_c8,real,4);
          VarnodeTpl::VarnodeTpl(pVVar8,&local_88,&local_a8,&local_c8);
          local_40 = pVVar8;
          OpTpl::addInput((OpTpl *)indvn,pVVar8);
          local_d8._M_current =
               (OpTpl **)std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::begin(&this->vec);
          __gnu_cxx::__normal_iterator<OpTpl*const*,std::vector<OpTpl*,std::allocator<OpTpl*>>>::
          __normal_iterator<OpTpl**>
                    ((__normal_iterator<OpTpl*const*,std::vector<OpTpl*,std::allocator<OpTpl*>>> *)
                     &local_d0,&local_d8);
          std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::insert
                    (&this->vec,local_d0,(value_type *)&indvn);
        }
      }
      return 0;
    }
    ppOVar3 = __gnu_cxx::
              __normal_iterator<OpTpl_**,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_>::
              operator*((__normal_iterator<OpTpl_**,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_>
                         *)&op);
    indvn = (VarnodeTpl *)*ppOVar3;
    OVar2 = OpTpl::getOpcode((OpTpl *)indvn);
    if (OVar2 == CPUI_MULTIEQUAL) {
      pVVar8 = OpTpl::getIn((OpTpl *)indvn,0);
      this_00 = VarnodeTpl::getOffset(pVVar8);
      uVar4 = ConstTpl::getReal(this_00);
      local_54 = (int)uVar4;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](check,(long)local_54);
      if (*pvVar7 != 0) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](check,(long)local_54);
        return *pvVar7;
      }
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](check,(long)local_54);
      *pvVar7 = 1;
    }
    __gnu_cxx::__normal_iterator<OpTpl_**,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_>::
    operator++((__normal_iterator<OpTpl_**,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_> *)&op);
  } while( true );
}

Assistant:

int4 ConstructTpl::fillinBuild(vector<int4> &check,AddrSpace *const_space)

{ // Make sure there is a build statement for all subtable params
  // Return 0 upon success, 1 if there is a duplicate BUILD, 2 if there is a build for a non-subtable
  vector<OpTpl *>::iterator iter;
  OpTpl *op;
  VarnodeTpl *indvn;

  for(iter=vec.begin();iter!=vec.end();++iter) {
    op = *iter;
    if (op->getOpcode() == BUILD) {
      int4 index = op->getIn(0)->getOffset().getReal();
      if (check[index] != 0)
	return check[index];	// Duplicate BUILD statement or non-subtable
      check[index] = 1;		// Mark to avoid future duplicate build
    }
  }
  for(int4 i=0;i<check.size();++i) {
    if (check[i] == 0) {	// Didn't see a BUILD statement
      op = new OpTpl(BUILD);
      indvn = new VarnodeTpl(ConstTpl(const_space),
			      ConstTpl(ConstTpl::real,i),
			      ConstTpl(ConstTpl::real,4));
      op->addInput(indvn);
      vec.insert(vec.begin(),op);
    }
  }
  return 0;
}